

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O1

sexp_conflict sexp_error_string(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict x)

{
  sexp_conflict psVar1;
  int *piVar2;
  char *pcVar3;
  int __errnum;
  
  if (x == (sexp_conflict)0x3e) {
    piVar2 = __errno_location();
    __errnum = *piVar2;
  }
  else {
    if (((ulong)x & 1) == 0) {
      psVar1 = (sexp_conflict)sexp_type_exception(ctx,self,2);
      return psVar1;
    }
    __errnum = (int)((ulong)x >> 1);
  }
  pcVar3 = strerror(__errnum);
  psVar1 = (sexp_conflict)sexp_c_string(ctx,pcVar3,0xffffffffffffffff);
  return psVar1;
}

Assistant:

sexp sexp_error_string (sexp ctx, sexp self, sexp_sint_t n, sexp x) {
#ifdef PLAN9
  return SEXP_FALSE;
#else
  int err;
  if (x == SEXP_FALSE) {
    err = errno;
  } else {
    sexp_assert_type(ctx, sexp_fixnump, SEXP_FIXNUM, x);
    err = sexp_unbox_fixnum(x);
  }
  return sexp_c_string(ctx, strerror(err), -1);
#endif
}